

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O3

int str_copy(CONF *conf,char *section,char **pto,char *from)

{
  byte bVar1;
  int iVar2;
  BUF_MEM *str;
  size_t sVar3;
  undefined4 extraout_var;
  byte bVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  str = BUF_MEM_new();
  if (str == (BUF_MEM *)0x0) {
    return 0;
  }
  sVar3 = strlen(section);
  iVar2 = BUF_MEM_grow(str,(long)((int)sVar3 + 1));
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = 0;
LAB_0021cb9d:
    for (; bVar1 = *section, 0x26 < bVar1; section = (char *)((byte *)section + 2)) {
      if (bVar1 == 0x60) goto LAB_0021cbce;
      if (bVar1 != 0x5c) {
        if (bVar1 != 0x27) goto LAB_0021cc29;
        goto LAB_0021cbce;
      }
      bVar1 = ((byte *)section)[1];
      if (bVar1 < 0x6e) {
        if (bVar1 == 0x62) {
          bVar4 = 8;
        }
        else {
          if (bVar1 == 0) goto LAB_0021cc9e;
LAB_0021cc80:
          bVar4 = bVar1;
          if (bVar1 == 0x74) {
            bVar4 = 9;
          }
        }
      }
      else {
        bVar4 = 0xd;
        if (bVar1 != 0x72) {
          if (bVar1 != 0x6e) goto LAB_0021cc80;
          bVar4 = 10;
        }
      }
      lVar5 = (long)iVar2;
      iVar2 = iVar2 + 1;
      str->data[lVar5] = bVar4;
    }
    if (bVar1 == 0x22) {
LAB_0021cbce:
      pbVar7 = (byte *)section + 1;
      bVar4 = ((byte *)section)[1];
      if (bVar4 != bVar1 && bVar4 != 0) {
        lVar5 = (long)iVar2;
        do {
          pbVar6 = pbVar7;
          if (bVar4 == 0x5c) {
            bVar4 = ((byte *)section)[2];
            pbVar7 = (byte *)section + 2;
            pbVar6 = pbVar7;
            if (bVar4 == 0) {
              bVar4 = 0;
              break;
            }
          }
          iVar2 = iVar2 + 1;
          str->data[lVar5] = bVar4;
          pbVar7 = pbVar6 + 1;
          bVar4 = pbVar6[1];
          if ((bVar4 == 0) || (lVar5 = lVar5 + 1, section = (char *)pbVar6, bVar4 == bVar1)) break;
        } while( true );
      }
      section = (char *)(pbVar7 + (bVar4 == bVar1));
      goto LAB_0021cb9d;
    }
    if (bVar1 == 0) {
LAB_0021cc9e:
      str->data[iVar2] = '\0';
      OPENSSL_free(conf->values);
      conf->values = (lhash_st_CONF_VALUE *)str->data;
      OPENSSL_free(str);
      return 1;
    }
    if (bVar1 != 0x24) {
LAB_0021cc29:
      section = (char *)((byte *)section + 1);
      lVar5 = (long)iVar2;
      iVar2 = iVar2 + 1;
      str->data[lVar5] = bVar1;
      goto LAB_0021cb9d;
    }
    ERR_put_error(0xd,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,0xdb);
  }
  BUF_MEM_free(str);
  return 0;
}

Assistant:

static int str_copy(CONF *conf, char *section, char **pto, char *from) {
  int q, to = 0, len = 0;
  char v;
  BUF_MEM *buf;

  buf = BUF_MEM_new();
  if (buf == NULL) {
    return 0;
  }

  len = strlen(from) + 1;
  if (!BUF_MEM_grow(buf, len)) {
    goto err;
  }

  for (;;) {
    if (is_quote(*from)) {
      q = *from;
      from++;
      while (*from != '\0' && *from != q) {
        if (is_esc(*from)) {
          from++;
          if (*from == '\0') {
            break;
          }
        }
        buf->data[to++] = *(from++);
      }
      if (*from == q) {
        from++;
      }
    } else if (is_esc(*from)) {
      from++;
      v = *(from++);
      if (v == '\0') {
        break;
      } else if (v == 'r') {
        v = '\r';
      } else if (v == 'n') {
        v = '\n';
      } else if (v == 'b') {
        v = '\b';
      } else if (v == 't') {
        v = '\t';
      }
      buf->data[to++] = v;
    } else if (*from == '\0') {
      break;
    } else if (*from == '$') {
      // Historically, $foo would expand to a previously-parsed value. This
      // feature has been removed as it was unused and is a DoS vector. If
      // trying to embed '$' in a line, either escape it or wrap the value in
      // quotes.
      OPENSSL_PUT_ERROR(CONF, CONF_R_VARIABLE_EXPANSION_NOT_SUPPORTED);
      goto err;
    } else {
      buf->data[to++] = *(from++);
    }
  }

  buf->data[to] = '\0';
  OPENSSL_free(*pto);
  *pto = buf->data;
  OPENSSL_free(buf);
  return 1;

err:
  BUF_MEM_free(buf);
  return 0;
}